

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HinOut.cpp
# Opt level: O2

void __thiscall HinOut::writeDataColumnWise(HinOut *this)

{
  ostream *poVar1;
  long lVar2;
  ofstream f;
  undefined8 auStack_218 [63];
  
  std::ofstream::ofstream((string *)&f);
  std::ofstream::open((string *)&f,(int)this + 2000);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&f,this->onumCol);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&f,this->onumRow);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&f,this->oAcountX);
  std::endl<char,std::char_traits<char>>(poVar1);
  for (lVar2 = 0; lVar2 <= this->onumCol; lVar2 = lVar2 + 1) {
    poVar1 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&f,
                        (this->oAstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar2]);
    std::operator<<(poVar1," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&f);
  for (lVar2 = 0; lVar2 < this->oAcountX; lVar2 = lVar2 + 1) {
    poVar1 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&f,
                        (this->oAindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar2]);
    std::operator<<(poVar1," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&f);
  *(undefined8 *)((long)auStack_218 + *(long *)(_f + -0x18)) = 9;
  for (lVar2 = 0; lVar2 < this->oAcountX; lVar2 = lVar2 + 1) {
    poVar1 = std::ostream::_M_insert<double>
                       ((this->oAvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar2]);
    std::operator<<(poVar1," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&f);
  *(undefined8 *)((long)auStack_218 + *(long *)(_f + -0x18)) = 9;
  for (lVar2 = 0; lVar2 < this->onumCol; lVar2 = lVar2 + 1) {
    poVar1 = std::ostream::_M_insert<double>
                       ((this->ocolCost).super__Vector_base<double,_std::allocator<double>_>._M_impl
                        .super__Vector_impl_data._M_start[lVar2]);
    std::operator<<(poVar1," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&f);
  for (lVar2 = 0; lVar2 < this->onumCol; lVar2 = lVar2 + 1) {
    poVar1 = std::ostream::_M_insert<double>
                       ((this->ocolLower).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar2]);
    std::operator<<(poVar1," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&f);
  for (lVar2 = 0; lVar2 < this->onumCol; lVar2 = lVar2 + 1) {
    poVar1 = std::ostream::_M_insert<double>
                       ((this->ocolUpper).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar2]);
    std::operator<<(poVar1," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&f);
  *(undefined8 *)((long)auStack_218 + *(long *)(_f + -0x18)) = 9;
  for (lVar2 = 0; lVar2 < this->onumRow; lVar2 = lVar2 + 1) {
    poVar1 = std::ostream::_M_insert<double>
                       ((this->orowLower).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar2]);
    std::operator<<(poVar1," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&f);
  for (lVar2 = 0; lVar2 < this->onumRow; lVar2 = lVar2 + 1) {
    poVar1 = std::ostream::_M_insert<double>
                       ((this->orowUpper).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar2]);
    std::operator<<(poVar1," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&f);
  std::ofstream::close();
  std::ofstream::~ofstream(&f);
  return;
}

Assistant:

void HinOut::writeDataColumnWise() {
	ofstream f;
	int i;

	f.open (fileOut, ios::out );

	//counts
	f << onumCol << endl;
	f << onumRow << endl;
	f << oAcountX << endl;



	//matrix
	for (i=0; i<onumCol+1; i++)
		f << oAstart[i]<<" ";
	f<<endl;

	for (i=0; i<oAcountX; i++)
		f << oAindex[i]<<" ";
	f<<endl;

	f<<setprecision(9);
	for (i=0; i<oAcountX; i++)
		f  << oAvalue[i]<<" ";

	f<<endl;


	//cost and bounds
	f<<setprecision(9);
	for (i=0; i<onumCol; i++)
			f << ocolCost[i]<<" ";

	f<<endl;


	for (i=0; i<onumCol; i++)
			f << ocolLower[i]<<" ";
	f<<endl;


	for (i=0; i<onumCol; i++)
			f <<  ocolUpper[i]<<" ";
	f<<endl;

	f<<setprecision(9);
	for (i=0; i<onumRow; i++)
			f << orowLower[i]<<" ";
	f<<endl;


	for (i=0; i<onumRow; i++)
			f << orowUpper[i]<<" ";
	f<<endl;

	f.close();

}